

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

void __thiscall Raytracer::Image::Image(Image *this,int _width,int _height)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  RGB **ppRVar4;
  ulong uVar5;
  RGB *pRVar6;
  RGB *local_58;
  int local_30;
  int x;
  int local_1c;
  int y;
  int _height_local;
  int _width_local;
  Image *this_local;
  
  this->width = _width;
  this->height = _height;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)_height;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ppRVar4 = (RGB **)operator_new__(uVar3);
  this->datas = ppRVar4;
  for (local_1c = 0; local_1c < this->height; local_1c = local_1c + 1) {
    uVar3 = (ulong)this->width;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar3;
    uVar5 = SUB168(auVar2 * ZEXT816(0xc),0);
    if (SUB168(auVar2 * ZEXT816(0xc),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    pRVar6 = (RGB *)operator_new__(uVar5);
    if (uVar3 != 0) {
      local_58 = pRVar6;
      do {
        RGB::RGB(local_58);
        local_58 = local_58 + 1;
      } while (local_58 != pRVar6 + uVar3);
    }
    this->datas[local_1c] = pRVar6;
    for (local_30 = 0; local_30 < this->width; local_30 = local_30 + 1) {
      this->datas[local_1c][local_30].r = 255.0;
      this->datas[local_1c][local_30].g = 0.0;
      this->datas[local_1c][local_30].b = 0.0;
    }
  }
  return;
}

Assistant:

Raytracer::Image::Image( int _width, int _height) {
    this->width = _width;
    this->height = _height;
    this->datas = new Raytracer::RGB * [_height];
    for(int y = 0;y<height;y++){
        datas[y] = new Raytracer::RGB[width];
        for(int x = 0;x<width;x++) {
            datas[y][x].r = 255.f;
            datas[y][x].g = 0.f;
            datas[y][x].b = 0.f;
        }
    }
}